

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
MILBlob::PackSubByteVecForNonByteAligned<MILBlob::UInt6>
          (Span<const_unsigned_char,_18446744073709551615UL> span)

{
  long lVar1;
  byte *pbVar2;
  reference puVar3;
  byte *pbVar4;
  range_error *this;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  ulong in_RDX;
  byte bVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  ulong uVar9;
  size_t index;
  double dVar10;
  undefined1 auVar11 [16];
  Span<const_unsigned_char,_18446744073709551615UL> local_160;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = in_RDX * 6;
  auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar11._0_8_ = lVar1;
  auVar11._12_4_ = 0x45300000;
  local_160.m_size.m_size = in_RDX;
  dVar10 = ceil(((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 0.125);
  local_150 = (long *)((ulong)local_150 & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_RDI,(long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10,
             (value_type_conflict1 *)&local_150,(allocator_type *)&local_f0);
  if (local_160.m_size.m_size != 0) {
    uVar9 = 0;
    index = 0;
    do {
      pbVar2 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[](&local_160,index)
      ;
      if (0x3f < *pbVar2) {
        this = (range_error *)__cxa_allocate_exception(0x10);
        pbVar2 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                           (&local_160,index);
        std::__cxx11::to_string(&local_90,(uint)*pbVar2);
        std::operator+(&local_70,"Value ",&local_90);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_130._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_130._M_dataplus._M_p == psVar6) {
          local_130.field_2._M_allocated_capacity = *psVar6;
          local_130.field_2._8_8_ = plVar5[3];
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar6;
        }
        local_130._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::to_string(&local_b0,0);
        std::operator+(&local_50,&local_130,&local_b0);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_110._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_110._M_dataplus._M_p == psVar6) {
          local_110.field_2._M_allocated_capacity = *psVar6;
          local_110.field_2._8_8_ = plVar5[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar6;
        }
        local_110._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::to_string(&local_d0,0x3f);
        std::operator+(&local_f0,&local_110,&local_d0);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_150 = (long *)*plVar5;
        plVar7 = plVar5 + 2;
        if (local_150 == plVar7) {
          local_140 = *plVar7;
          lStack_138 = plVar5[3];
          local_150 = &local_140;
        }
        else {
          local_140 = *plVar7;
        }
        local_148 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::range_error::range_error(this,(string *)&local_150);
        __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
      }
      Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[](&local_160,index);
      puVar3 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[](&local_160,index)
      ;
      bVar8 = (byte)uVar9 & 6;
      pbVar2 = (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start + (uVar9 >> 3);
      *pbVar2 = *pbVar2 | *puVar3 << bVar8;
      if (2 < bVar8) {
        pbVar4 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                           (&local_160,index);
        pbVar2 = (in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start + (uVar9 >> 3) + 1;
        *pbVar2 = *pbVar2 | *pbVar4 >> (8 - bVar8 & 0x1f);
      }
      index = index + 1;
      uVar9 = uVar9 + 6;
    } while (index < local_160.m_size.m_size);
  }
  return in_RDI;
}

Assistant:

std::vector<uint8_t> PackSubByteVecForNonByteAligned(Util::Span<const decltype(T::data)> span)
{
    std::vector<uint8_t> ret(MILBlob::SizeInBytes<T>(span.Size()), 0);

    for (uint64_t i = 0; i < span.Size(); i++) {
        MILVerifyIsTrue(span[i] <= T::MAX && span[i] >= T::MIN,
                        std::range_error,
                        "Value " + std::to_string(span[i]) + " is outside allowed subbyte datatype range [" +
                            std::to_string(T::MIN) + ", " + std::to_string(T::MAX) + "].");

        auto indexAndOffset = GetIndexAndOffsetForSubByteValue(i, T::SizeInBits);
        auto idx = indexAndOffset.index;
        auto offset = indexAndOffset.offset;

        ret[idx] |= ((uint8_t)(span[i] << offset));
        if (offset > 8 - T::SizeInBits) {
            // part of the i'th element of span spills over to idx+1
            // uint8_t rshift = T::SizeInBits - (8 - offset);
            uint8_t rshift = 8 - offset;
            ret[idx + 1] |= ((uint8_t)span[i] >> rshift);
        }
    }

    return ret;
}